

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::MessageLite::OnDemandRegisterArenaDtor(MessageLite *this,Arena *arena)

{
  code *UNRECOVERED_JUMPTABLE;
  int iVar1;
  undefined4 extraout_var;
  MessageLite local_20;
  
  if (arena != (Arena *)0x0) {
    iVar1 = (*this->_vptr_MessageLite[4])();
    if (CONCAT44(extraout_var,iVar1) == 0) {
      OnDemandRegisterArenaDtor(&local_20);
    }
    UNRECOVERED_JUMPTABLE = *(code **)(CONCAT44(extraout_var,iVar1) + 0x10);
    if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(this,arena);
      return;
    }
  }
  return;
}

Assistant:

void MessageLite::OnDemandRegisterArenaDtor(Arena* arena) {
  if (arena == nullptr) return;
  auto* data = GetClassData();
  ABSL_DCHECK(data != nullptr);

  if (data->on_demand_register_arena_dtor != nullptr) {
    data->on_demand_register_arena_dtor(*this, *arena);
  }
}